

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

int __thiscall llvm::APInt::compare(APInt *this,APInt *RHS)

{
  WordType *lhs;
  WordType *rhs;
  bool bVar1;
  uint parts;
  uint local_34;
  APInt *RHS_local;
  APInt *this_local;
  
  if (this->BitWidth != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be same for comparison\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x113,"int llvm::APInt::compare(const APInt &) const");
  }
  bVar1 = isSingleWord(this);
  if (bVar1) {
    if ((this->U).VAL < (RHS->U).VAL) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = (uint)((RHS->U).VAL < (this->U).VAL);
    }
    this_local._4_4_ = local_34;
  }
  else {
    lhs = (this->U).pVal;
    rhs = (RHS->U).pVal;
    parts = getNumWords(this);
    this_local._4_4_ = tcCompare(lhs,rhs,parts);
  }
  return this_local._4_4_;
}

Assistant:

int APInt::compare(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be same for comparison");
  if (isSingleWord())
    return U.VAL < RHS.U.VAL ? -1 : U.VAL > RHS.U.VAL;

  return tcCompare(U.pVal, RHS.U.pVal, getNumWords());
}